

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cshutdn.c
# Opt level: O1

size_t Curl_cshutdn_dest_count(Curl_easy *data,char *destination)

{
  int iVar1;
  Curl_llist_node *n;
  void *pvVar2;
  size_t sVar3;
  
  if (((data == (Curl_easy *)0x0) || (data->multi == (Curl_multi *)0x0)) ||
     (n = Curl_llist_head(&(data->multi->cshutdn).list), n == (Curl_llist_node *)0x0)) {
    sVar3 = 0;
  }
  else {
    sVar3 = 0;
    do {
      pvVar2 = Curl_node_elem(n);
      iVar1 = strcmp(destination,*(char **)((long)pvVar2 + 0x58));
      sVar3 = sVar3 + (iVar1 == 0);
      n = Curl_node_next(n);
    } while (n != (Curl_llist_node *)0x0);
  }
  return sVar3;
}

Assistant:

size_t Curl_cshutdn_dest_count(struct Curl_easy *data,
                               const char *destination)
{
  if(data && data->multi) {
    struct cshutdn *csd = &data->multi->cshutdn;
    size_t n = 0;
    struct Curl_llist_node *e = Curl_llist_head(&csd->list);
    while(e) {
      struct connectdata *conn = Curl_node_elem(e);
      if(!strcmp(destination, conn->destination))
        ++n;
      e = Curl_node_next(e);
    }
    return n;
  }
  return 0;
}